

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O2

Nodes * __thiscall
crawler::Node::getElementsByTag(Nodes *__return_storage_ptr__,Node *this,string *tagName)

{
  pointer pNVar1;
  __type_conflict _Var2;
  variant_alternative_t<0UL,_variant<ElementData,_basic_string<char>_>_> *__lhs;
  Node *childrenNode;
  pointer pNVar3;
  queue<crawler::Node,_std::deque<crawler::Node,_std::allocator<crawler::Node>_>_> queue;
  Node tempNode;
  Node root;
  vector<crawler::Node,_std::allocator<crawler::Node>_> local_1a8;
  queue<crawler::Node,_std::deque<crawler::Node,_std::allocator<crawler::Node>_>_> local_190;
  Node local_140;
  Node local_b8;
  
  (__return_storage_ptr__->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::queue<crawler::Node,std::deque<crawler::Node,std::allocator<crawler::Node>>>::
  queue<std::deque<crawler::Node,std::allocator<crawler::Node>>,void>(&local_190);
  Node(&local_b8,this);
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back(&local_190.c,&local_b8);
  while (local_190.c.super__Deque_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         local_190.c.super__Deque_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    Node(&local_140,
         local_190.c.super__Deque_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur);
    std::deque<crawler::Node,_std::allocator<crawler::Node>_>::pop_front(&local_190.c);
    if (local_140.nodeType == Element) {
      __lhs = std::get<0ul,crawler::ElementData,std::__cxx11::string>(&local_140.nodeData);
      _Var2 = std::operator==(&__lhs->tagName,tagName);
      if (_Var2) {
        std::vector<crawler::Node,std::allocator<crawler::Node>>::emplace_back<crawler::Node&>
                  ((vector<crawler::Node,std::allocator<crawler::Node>> *)__return_storage_ptr__,
                   &local_140);
      }
    }
    std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
              (&local_1a8,&local_140.children);
    pNVar3 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pNVar1 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1a8);
    if (pNVar1 != pNVar3) {
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                (&local_1a8,&local_140.children);
      pNVar1 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pNVar3 = local_1a8.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start; pNVar3 != pNVar1; pNVar3 = pNVar3 + 1)
      {
        std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back(&local_190.c,pNVar3);
      }
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1a8);
    }
    ~Node(&local_140);
  }
  ~Node(&local_b8);
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::~deque(&local_190.c);
  return __return_storage_ptr__;
}

Assistant:

crawler::Nodes crawler::Node::getElementsByTag(const std::string &tagName) {
  return getElementsByPredicate([&tagName](const Node &node) -> bool {
    return node.getElementData().getTagName() == tagName;
  });
}